

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int_scan.cpp
# Opt level: O3

void Omega_h::fill_right(Write<int> *a)

{
  Alloc *pAVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_a1;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_int_scan.cpp"
             ,"");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_40);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_70 = *puVar6;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar6;
    local_80 = (ulong *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,'\x02');
  *(undefined2 *)local_60 = 0x3632;
  uVar7 = 0xf;
  if (local_80 != &local_70) {
    uVar7 = local_70;
  }
  if (uVar7 < (ulong)(local_58 + local_78)) {
    uVar7 = 0xf;
    if (local_60 != local_50) {
      uVar7 = local_50[0];
    }
    if ((ulong)(local_58 + local_78) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      goto LAB_002efe4c;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60);
LAB_002efe4c:
  local_a0 = &local_90;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_90 = *plVar3;
    uStack_88 = puVar4[3];
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*puVar4;
  }
  local_98 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  begin_code("fill_right",(char *)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pAVar1 = (a->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar7 = pAVar1->size;
  }
  else {
    uVar7 = (ulong)pAVar1 >> 3;
  }
  uVar8 = (ulong)(int)(uVar7 >> 2);
  if (0 < (long)uVar8) {
    piVar2 = (int *)(a->shared_alloc_).direct_ptr;
    entering_parallel = 0;
    if ((uVar7 & 0x3fffffffc) != 4) {
      iVar5 = *piVar2;
      uVar7 = 2;
      if (2 < uVar8) {
        uVar7 = uVar8;
      }
      uVar8 = 1;
      do {
        if (iVar5 <= piVar2[uVar8]) {
          iVar5 = piVar2[uVar8];
        }
        piVar2[uVar8] = iVar5;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  ScopedTimer::~ScopedTimer(&local_a1);
  return;
}

Assistant:

void fill_right(Write<LO> a) {
  OMEGA_H_TIME_FUNCTION;
  auto const first = a.begin();
  auto const last = a.end();
  auto const result = a.begin();
  auto const op = maximum<LO>();
  auto transform = identity<LO>();
  transform_inclusive_scan(first, last, result, op, std::move(transform));
}